

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O3

int64_t __thiscall llvm::DataExtractor::getSLEB128(DataExtractor *this,uint64_t *offset_ptr)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  uint Shift;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t *orig_p;
  
  uVar2 = *offset_ptr;
  uVar4 = (this->Data).Length;
  if (uVar4 < uVar2) {
    __assert_fail("*offset_ptr <= Data.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                  ,0xc4,"int64_t llvm::DataExtractor::getSLEB128(uint64_t *) const");
  }
  pcVar3 = (this->Data).Data;
  uVar7 = 0;
  uVar6 = 0;
  uVar5 = 0;
  do {
    if (pcVar3 != (char *)0x0 && uVar4 - uVar2 == uVar7) {
      return 0;
    }
    bVar1 = pcVar3[uVar7 + uVar2];
    uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)uVar5 & 0x3f);
    uVar5 = uVar5 + 7;
    uVar7 = uVar7 + 1;
  } while ((char)bVar1 < '\0');
  uVar4 = -1L << ((byte)uVar5 & 0x3f);
  if (bVar1 < 0x40) {
    uVar4 = 0;
  }
  if (0x3f < uVar5) {
    uVar4 = 0;
  }
  *offset_ptr = (uVar7 & 0xffffffff) + uVar2;
  return uVar6 | uVar4;
}

Assistant:

int64_t DataExtractor::getSLEB128(uint64_t *offset_ptr) const {
  assert(*offset_ptr <= Data.size());

  const char *error;
  unsigned bytes_read;
  int64_t result = decodeSLEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error)
    return 0;
  *offset_ptr += bytes_read;
  return result;
}